

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void amrex::ParmParse::Initialize(int argc,char **argv,char *parfile)

{
  undefined4 in_EDI;
  Table *in_stack_00000048;
  char *in_stack_00000050;
  char **in_stack_00000058;
  int in_stack_00000064;
  undefined4 in_stack_fffffffffffffff0;
  
  if (((anonymous_namespace)::(anonymous_namespace)::initialized & 1) != 0) {
    Error_host((char *)CONCAT44(in_EDI,in_stack_fffffffffffffff0));
  }
  anon_unknown_12::ppinit(in_stack_00000064,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  ExecOnFinalize((PTR_TO_VOID_FUNC)0x11a48c7);
  return;
}

Assistant:

void
ParmParse::Initialize (int         argc,
                       char**      argv,
                       const char* parfile)
{
    if ( initialized )
    {
        amrex::Error("ParmParse::Initialize(): already initialized!");
    }

    ppinit(argc, argv, parfile, g_table);

    amrex::ExecOnFinalize(ParmParse::Finalize);
}